

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

void __thiscall obs::safe_list<obs::slot<int_(int)>_>::node::unlock_all(node *this)

{
  bool bVar1;
  iterator *local_18;
  iterator *it;
  node *this_local;
  
  bVar1 = in_creator_thread(this);
  if (bVar1) {
    for (local_18 = this->creator_thread_iterator; local_18 != (iterator *)0x0;
        local_18 = local_18->m_next_iterator) {
      iterator::notify_unlock(local_18,this);
      if (this->locks < 1) {
        __assert_fail("locks > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                      ,0x1c9,
                      "void obs::safe_list<obs::slot<int (int)>>::node::unlock_all() [T = obs::slot<int (int)>]"
                     );
      }
      this->locks = this->locks + -1;
    }
    this->creator_thread_iterator = (iterator *)0x0;
  }
  return;
}

Assistant:

void safe_list<T>::node::unlock_all() {
  if (in_creator_thread()) {
    // Notify to all iterators in the creator thread that they don't
    // have the node locked anymore. In this way we can continue the
    // erase() call.
    for (auto it=creator_thread_iterator; it; it=it->m_next_iterator) {
      it->notify_unlock(this);

      assert(locks > 0);
      --locks;
    }
    creator_thread_iterator = nullptr;
  }
}